

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O2

void __thiscall google::protobuf::io::Tokenizer::ConsumeString(Tokenizer *this,char delimiter)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  allocator<char> local_51;
  string local_50;
  
LAB_00202b1c:
  do {
    while (cVar1 = this->current_char_, cVar1 == '\n') {
      if (this->allow_multiline_strings_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"Multiline strings are not allowed. Did you miss a \"?.",
                   &local_51);
        AddError(this,&local_50);
LAB_00202d76:
        std::__cxx11::string::~string((string *)&local_50);
        return;
      }
LAB_00202be1:
      NextChar(this);
    }
    if (cVar1 == '\\') {
      NextChar(this);
      bVar2 = this->current_char_;
      if ((((bVar2 - 0x61 < 0x16) && ((0x2a2023U >> (bVar2 - 0x61 & 0x1f) & 1) != 0)) ||
          ((bVar2 - 0x22 < 0x3b && ((0x400000020000021U >> ((ulong)(bVar2 - 0x22) & 0x3f) & 1) != 0)
           ))) || ((bVar2 & 0xf8) == 0x30)) goto LAB_00202be1;
      bVar3 = TryConsume(this,'x');
      if ((bVar3) || (bVar3 = TryConsume(this,'X'), bVar3)) {
        bVar3 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::HexDigit>(this);
        if (bVar3) goto LAB_00202b1c;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"Expected hex digits for escape sequence.",&local_51);
        AddError(this,&local_50);
      }
      else {
        bVar3 = TryConsume(this,'u');
        if (bVar3) {
          bVar3 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::HexDigit>(this);
          if (((bVar3) &&
              (bVar3 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::HexDigit>(this),
              bVar3)) &&
             ((bVar3 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::HexDigit>(this),
              bVar3 && (bVar3 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::HexDigit>
                                          (this), bVar3)))) goto LAB_00202b1c;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"Expected four hex digits for \\u escape sequence.",
                     &local_51);
          AddError(this,&local_50);
        }
        else {
          bVar3 = TryConsume(this,'U');
          if (bVar3) {
            bVar3 = TryConsume(this,'0');
            if ((((bVar3) && (bVar3 = TryConsume(this,'0'), bVar3)) &&
                ((bVar3 = TryConsume(this,'0'), bVar3 || (bVar3 = TryConsume(this,'1'), bVar3)))) &&
               ((((bVar3 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::HexDigit>
                                     (this), bVar3 &&
                  (bVar3 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::HexDigit>
                                     (this), bVar3)) &&
                 (bVar3 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::HexDigit>(this)
                 , bVar3)) &&
                ((bVar3 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::HexDigit>(this)
                 , bVar3 &&
                 (bVar3 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::HexDigit>(this)
                 , bVar3)))))) goto LAB_00202b1c;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,
                       "Expected eight hex digits up to 10ffff for \\U escape sequence",&local_51);
            AddError(this,&local_50);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,"Invalid escape sequence in string literal.",&local_51);
            AddError(this,&local_50);
          }
        }
      }
      std::__cxx11::string::~string((string *)&local_50);
      goto LAB_00202b1c;
    }
    if (cVar1 == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Unexpected end of string.",&local_51);
      AddError(this,&local_50);
      goto LAB_00202d76;
    }
    NextChar(this);
    if (cVar1 == delimiter) {
      return;
    }
  } while( true );
}

Assistant:

void Tokenizer::ConsumeString(char delimiter) {
  while (true) {
    switch (current_char_) {
      case '\0':
        AddError("Unexpected end of string.");
        return;

      case '\n': {
        if (!allow_multiline_strings_) {
          AddError("Multiline strings are not allowed. Did you miss a \"?.");
          return;
        }
        NextChar();
        break;
      }

      case '\\': {
        // An escape sequence.
        NextChar();
        if (TryConsumeOne<Escape>()) {
          // Valid escape sequence.
        } else if (TryConsumeOne<OctalDigit>()) {
          // Possibly followed by two more octal digits, but these will
          // just be consumed by the main loop anyway so we don't need
          // to do so explicitly here.
        } else if (TryConsume('x') || TryConsume('X')) {
          if (!TryConsumeOne<HexDigit>()) {
            AddError("Expected hex digits for escape sequence.");
          }
          // Possibly followed by another hex digit, but again we don't care.
        } else if (TryConsume('u')) {
          if (!TryConsumeOne<HexDigit>() || !TryConsumeOne<HexDigit>() ||
              !TryConsumeOne<HexDigit>() || !TryConsumeOne<HexDigit>()) {
            AddError("Expected four hex digits for \\u escape sequence.");
          }
        } else if (TryConsume('U')) {
          // We expect 8 hex digits; but only the range up to 0x10ffff is
          // legal.
          if (!TryConsume('0') || !TryConsume('0') ||
              !(TryConsume('0') || TryConsume('1')) ||
              !TryConsumeOne<HexDigit>() || !TryConsumeOne<HexDigit>() ||
              !TryConsumeOne<HexDigit>() || !TryConsumeOne<HexDigit>() ||
              !TryConsumeOne<HexDigit>()) {
            AddError(
                "Expected eight hex digits up to 10ffff for \\U escape "
                "sequence");
          }
        } else {
          AddError("Invalid escape sequence in string literal.");
        }
        break;
      }

      default: {
        if (current_char_ == delimiter) {
          NextChar();
          return;
        }
        NextChar();
        break;
      }
    }
  }
}